

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_expression.hpp
# Opt level: O1

string * __thiscall
duckdb::WindowExpression::
ToString<duckdb::WindowExpression,duckdb::ParsedExpression,duckdb::OrderByNode>
          (string *__return_storage_ptr__,WindowExpression *this,WindowExpression *entry,
          string *schema,string *function_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _func_int **pp_Var3;
  pointer pcVar4;
  pointer pOVar5;
  pointer pOVar6;
  pointer puVar7;
  pointer puVar8;
  long lVar9;
  long *plVar10;
  pointer pPVar11;
  undefined8 *puVar12;
  string *psVar13;
  InternalException *pIVar14;
  size_type *psVar15;
  ulong *puVar16;
  char *pcVar17;
  char *pcVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar19;
  anon_class_8_1_2b093797 in_R9;
  long lVar20;
  string to;
  string units;
  string sep;
  string from;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  lVar20 = *(long *)&(entry->super_ParsedExpression).super_BaseExpression.type;
  if (lVar20 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar4 = (schema->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar4,pcVar4 + schema->_M_string_length);
  }
  else {
    local_50[0] = local_40;
    pp_Var3 = (entry->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression;
    ::std::__cxx11::string::_M_construct<char*>((string *)local_50,pp_Var3,(long)pp_Var3 + lVar20);
    ::std::__cxx11::string::append((char *)local_50);
    plVar10 = (long *)::std::__cxx11::string::_M_append
                                ((char *)local_50,(ulong)(schema->_M_dataplus)._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar15 = (size_type *)(plVar10 + 2);
    if ((size_type *)*plVar10 == psVar15) {
      lVar9 = plVar10[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar15;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar9;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar10;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar15;
    }
    __return_storage_ptr__->_M_string_length = plVar10[1];
    *plVar10 = (long)psVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
  }
  if ((lVar20 != 0) && (local_50[0] != local_40)) {
    operator_delete(local_50[0]);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  lVar20 = (long)(this->children).
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->children).
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (lVar20 != 0) {
    local_90._M_dataplus._M_p =
         (pointer)(CONCAT44(local_90._M_dataplus._M_p._4_4_,(uint)this->distinct) ^ 1);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,", ","");
    StringUtil::
    Join<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,unsigned_long,duckdb::WindowExpression::ToString<duckdb::WindowExpression,duckdb::ParsedExpression,duckdb::OrderByNode>(duckdb::WindowExpression_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>const&)_1_>
              (&local_b0,(StringUtil *)&this->children,
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)(lVar20 >> 3),(unsigned_long)&local_d0,&local_90,in_R9);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  if ((this->offset_expr).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    pPVar11 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(&this->offset_expr);
    (*(pPVar11->super_BaseExpression)._vptr_BaseExpression[8])(&local_b0,pPVar11);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  if ((this->default_expr).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    pPVar11 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(&this->default_expr);
    (*(pPVar11->super_BaseExpression)._vptr_BaseExpression[8])(&local_b0,pPVar11);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
  }
  if ((this->arg_orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
      super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->arg_orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
      super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    pOVar5 = (this->arg_orders).
             super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
             super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
             super__Vector_impl_data._M_start;
    pOVar6 = (this->arg_orders).
             super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
             super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,", ","");
    StringUtil::
    Join<duckdb::vector<duckdb::OrderByNode,true>,unsigned_long,duckdb::WindowExpression::ToString<duckdb::WindowExpression,duckdb::ParsedExpression,duckdb::OrderByNode>(duckdb::WindowExpression_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(duckdb::OrderByNode_const&)_1_>
              (&local_b0,(StringUtil *)&this->arg_orders,(long)pOVar6 - (long)pOVar5 >> 4,&local_d0)
    ;
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  if (this->ignore_nulls == true) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((this->filter_expr).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    pPVar11 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(&this->filter_expr);
    (*(pPVar11->super_BaseExpression)._vptr_BaseExpression[8])(&local_d0);
    plVar10 = (long *)::std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x1388d02);
    puVar16 = (ulong *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_b0.field_2._M_allocated_capacity = *puVar16;
      local_b0.field_2._8_8_ = plVar10[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *puVar16;
      local_b0._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_b0._M_string_length = plVar10[1];
    *plVar10 = (long)puVar16;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_allocated_capacity =
       local_b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if ((this->partitions).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->partitions).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    puVar7 = (this->partitions).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar8 = (this->partitions).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,", ","");
    StringUtil::
    Join<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>,unsigned_long,duckdb::WindowExpression::ToString<duckdb::WindowExpression,duckdb::ParsedExpression,duckdb::OrderByNode>(duckdb::WindowExpression_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>const&)_2_>
              (&local_d0,(StringUtil *)&this->partitions,(long)puVar8 - (long)puVar7 >> 3,&local_90)
    ;
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_d0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    ::std::__cxx11::string::_M_replace
              ((ulong)&local_b0,0,(char *)local_b0._M_string_length,0x14a8785);
  }
  if ((this->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
      super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
      super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_b0._M_dataplus._M_p);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    pOVar5 = (this->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
             super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
             super__Vector_impl_data._M_start;
    pOVar6 = (this->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
             super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,", ","");
    StringUtil::
    Join<duckdb::vector<duckdb::OrderByNode,true>,unsigned_long,duckdb::WindowExpression::ToString<duckdb::WindowExpression,duckdb::ParsedExpression,duckdb::OrderByNode>(duckdb::WindowExpression_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)::_lambda(duckdb::OrderByNode_const&)_2_>
              (&local_d0,(StringUtil *)&this->orders,(long)pOVar6 - (long)pOVar5 >> 4,&local_90);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_d0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    ::std::__cxx11::string::_M_replace
              ((ulong)&local_b0,0,(char *)local_b0._M_string_length,0x14a8785);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"ROWS","");
  paVar2 = &local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)paVar2;
  switch(this->start) {
  case INVALID:
  case UNBOUNDED_FOLLOWING:
    pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,"Unrecognized FROM in WindowExpression","");
    InternalException::InternalException(pIVar14,&local_110);
    __cxa_throw(pIVar14,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case UNBOUNDED_PRECEDING:
    if (this->end != CURRENT_ROW_RANGE) {
      ::std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)0x0,0x1498f64);
    }
    break;
  case CURRENT_ROW_RANGE:
  case CURRENT_ROW_ROWS:
  case CURRENT_ROW_GROUPS:
    ::std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)0x0,0x1388d2a);
    if (this->start == CURRENT_ROW_RANGE) {
LAB_0076a517:
      local_110._M_string_length = 5;
      local_110.field_2._M_allocated_capacity._0_6_ = 0x45474e4152;
    }
    else {
      if (this->start != CURRENT_ROW_ROWS) goto LAB_0076a47f;
LAB_0076a344:
      local_110._M_string_length = 4;
      local_110.field_2._M_allocated_capacity._0_5_ = 0x53574f52;
    }
    goto LAB_0076a532;
  case EXPR_PRECEDING_ROWS:
  case EXPR_PRECEDING_RANGE:
  case EXPR_PRECEDING_GROUPS:
    pPVar11 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(&this->start_expr);
    (*(pPVar11->super_BaseExpression)._vptr_BaseExpression[8])(&local_f0,pPVar11);
    puVar12 = (undefined8 *)::std::__cxx11::string::append((char *)&local_f0);
    puVar16 = puVar12 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_110.field_2._M_allocated_capacity = *puVar16;
      local_110.field_2._8_8_ = puVar12[3];
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *puVar16;
      local_110._M_dataplus._M_p = (pointer)*puVar12;
    }
    local_110._M_string_length = puVar12[1];
    *puVar12 = puVar16;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)&local_90,(string *)&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if (this->start == EXPR_PRECEDING_RANGE) goto LAB_0076a517;
    if (this->start == EXPR_PRECEDING_ROWS) goto LAB_0076a344;
    goto LAB_0076a47f;
  case EXPR_FOLLOWING_ROWS:
  case EXPR_FOLLOWING_RANGE:
  case EXPR_FOLLOWING_GROUPS:
    pPVar11 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(&this->start_expr);
    (*(pPVar11->super_BaseExpression)._vptr_BaseExpression[8])(&local_f0,pPVar11);
    plVar10 = (long *)::std::__cxx11::string::append((char *)&local_f0);
    puVar16 = (ulong *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar16) {
      local_110.field_2._M_allocated_capacity = *puVar16;
      local_110.field_2._8_8_ = plVar10[3];
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *puVar16;
      local_110._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_110._M_string_length = plVar10[1];
    *plVar10 = (long)puVar16;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)&local_90,(string *)&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if (this->start == EXPR_FOLLOWING_RANGE) goto LAB_0076a517;
    if (this->start == EXPR_FOLLOWING_ROWS) goto LAB_0076a344;
LAB_0076a47f:
    local_110._M_string_length = 6;
    local_110.field_2._M_allocated_capacity._0_7_ = 0x5350554f5247;
LAB_0076a532:
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    ::std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
  }
  paVar1 = &local_110.field_2;
  local_110._M_string_length = 0;
  local_110.field_2._M_allocated_capacity =
       local_110.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_110._M_dataplus._M_p = (pointer)paVar1;
  if (EXPR_FOLLOWING_GROUPS < this->end) goto LAB_0076a86a;
  pbVar19 = &local_110;
  switch(this->end) {
  case INVALID:
    pIVar14 = (InternalException *)__cxa_allocate_exception(0x10);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"Unrecognized TO in WindowExpression","");
    InternalException::InternalException(pIVar14,&local_f0);
    __cxa_throw(pIVar14,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case UNBOUNDED_PRECEDING:
    pcVar18 = (char *)0x0;
    pcVar17 = "UNBOUNDED PRECEDING";
    break;
  case UNBOUNDED_FOLLOWING:
    pcVar17 = "UNBOUNDED FOLLOWING";
    pcVar18 = (char *)0x0;
    break;
  case CURRENT_ROW_RANGE:
    if (this->start == UNBOUNDED_PRECEDING) goto LAB_0076a86a;
    ::std::__cxx11::string::_M_replace((ulong)pbVar19,0,(char *)0x0,0x1388d2a);
    pcVar17 = "RANGE";
    pcVar18 = (char *)local_d0._M_string_length;
    pbVar19 = &local_d0;
    break;
  case CURRENT_ROW_ROWS:
  case CURRENT_ROW_GROUPS:
    ::std::__cxx11::string::_M_replace((ulong)pbVar19,0,(char *)0x0,0x1388d2a);
    if (this->end == CURRENT_ROW_RANGE) {
LAB_0076a7a4:
      local_f0._M_string_length = 5;
      local_f0.field_2._M_allocated_capacity._0_6_ = 0x45474e4152;
    }
    else {
      if (this->end == CURRENT_ROW_ROWS) goto LAB_0076a6fb;
LAB_0076a785:
      local_f0._M_string_length = 6;
      local_f0.field_2._M_allocated_capacity._0_7_ = 0x5350554f5247;
    }
    goto LAB_0076a7bf;
  default:
    pPVar11 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(&this->end_expr);
    (*(pPVar11->super_BaseExpression)._vptr_BaseExpression[8])(local_70,pPVar11);
    plVar10 = (long *)::std::__cxx11::string::append((char *)local_70);
    psVar15 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar15) {
      local_f0.field_2._M_allocated_capacity = *psVar15;
      local_f0.field_2._8_8_ = plVar10[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar15;
      local_f0._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_f0._M_string_length = plVar10[1];
    *plVar10 = (long)psVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)&local_110,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    if (this->end == EXPR_PRECEDING_RANGE) goto LAB_0076a7a4;
    if (this->end != EXPR_PRECEDING_ROWS) goto LAB_0076a785;
    goto LAB_0076a6fb;
  case EXPR_FOLLOWING_ROWS:
  case EXPR_FOLLOWING_RANGE:
  case EXPR_FOLLOWING_GROUPS:
    pPVar11 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(&this->end_expr);
    (*(pPVar11->super_BaseExpression)._vptr_BaseExpression[8])(local_70,pPVar11);
    puVar12 = (undefined8 *)::std::__cxx11::string::append((char *)local_70);
    psVar15 = puVar12 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar15) {
      local_f0.field_2._M_allocated_capacity = *psVar15;
      local_f0.field_2._8_8_ = puVar12[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar15;
      local_f0._M_dataplus._M_p = (pointer)*puVar12;
    }
    local_f0._M_string_length = puVar12[1];
    *puVar12 = psVar15;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)&local_110,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0]);
    }
    if (this->end == EXPR_FOLLOWING_RANGE) goto LAB_0076a7a4;
    if (this->end != EXPR_FOLLOWING_ROWS) goto LAB_0076a785;
LAB_0076a6fb:
    local_f0._M_string_length = 4;
    local_f0.field_2._M_allocated_capacity._0_5_ = 0x53574f52;
LAB_0076a7bf:
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    ::std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    goto LAB_0076a86a;
  }
  ::std::__cxx11::string::_M_replace((ulong)pbVar19,0,pcVar18,(ulong)pcVar17);
LAB_0076a86a:
  if (this->exclude_clause != NO_OTHER) {
    if (local_90._M_string_length == 0) {
      ::std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)0x0,0x1498f64);
    }
    if (local_110._M_string_length == 0) {
      ::std::__cxx11::string::_M_replace((ulong)&local_110,0,(char *)0x0,0x1388d2a);
      ::std::__cxx11::string::_M_replace
                ((ulong)&local_d0,0,(char *)local_d0._M_string_length,0x13b9eb2);
    }
  }
  if (local_110._M_string_length != 0 || local_90._M_string_length != 0) {
    ::std::operator+(&local_f0,&local_b0,&local_d0);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
  }
  if ((local_90._M_string_length == 0) || (local_110._M_string_length == 0)) {
    if (local_90._M_string_length == 0) {
      if (local_110._M_string_length == 0) goto LAB_0076a9a6;
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      goto LAB_0076a970;
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    psVar13 = &local_90;
  }
  else {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_90._M_dataplus._M_p);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_0076a970:
    psVar13 = &local_110;
  }
  ::std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,(ulong)(psVar13->_M_dataplus)._M_p);
LAB_0076a9a6:
  if (this->exclude_clause != NO_OTHER) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if ((byte)(this->exclude_clause - CURRENT_ROW) < 3) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar1) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

static string ToString(const T &entry, const string &schema, const string &function_name) {
		// Start with function call
		string result = schema.empty() ? function_name : schema + "." + function_name;
		result += "(";
		if (entry.children.size()) {
			//	Only one DISTINCT is allowed (on the first argument)
			int distincts = entry.distinct ? 0 : 1;
			result += StringUtil::Join(entry.children, entry.children.size(), ", ", [&](const unique_ptr<BASE> &child) {
				return (distincts++ ? "" : "DISTINCT ") + child->ToString();
			});
		}
		// Lead/Lag extra arguments
		if (entry.offset_expr.get()) {
			result += ", ";
			result += entry.offset_expr->ToString();
		}
		if (entry.default_expr.get()) {
			result += ", ";
			result += entry.default_expr->ToString();
		}
		// ORDER BY arguments
		if (!entry.arg_orders.empty()) {
			result += " ORDER BY ";
			result += StringUtil::Join(entry.arg_orders, entry.arg_orders.size(), ", ",
			                           [](const ORDER_NODE &order) { return order.ToString(); });
		}

		// IGNORE NULLS
		if (entry.ignore_nulls) {
			result += " IGNORE NULLS";
		}
		// FILTER
		if (entry.filter_expr) {
			result += ") FILTER (WHERE " + entry.filter_expr->ToString();
		}

		// Over clause
		result += ") OVER (";
		string sep;

		// Partitions
		if (!entry.partitions.empty()) {
			result += "PARTITION BY ";
			result += StringUtil::Join(entry.partitions, entry.partitions.size(), ", ",
			                           [](const unique_ptr<BASE> &partition) { return partition->ToString(); });
			sep = " ";
		}

		// Orders
		if (!entry.orders.empty()) {
			result += sep;
			result += "ORDER BY ";
			result += StringUtil::Join(entry.orders, entry.orders.size(), ", ",
			                           [](const ORDER_NODE &order) { return order.ToString(); });
			sep = " ";
		}

		// Rows/Range
		string units = "ROWS";
		string from;
		switch (entry.start) {
		case WindowBoundary::CURRENT_ROW_RANGE:
		case WindowBoundary::CURRENT_ROW_ROWS:
		case WindowBoundary::CURRENT_ROW_GROUPS:
			from = "CURRENT ROW";
			units = ToUnits(entry.start, WindowBoundary::CURRENT_ROW_ROWS, WindowBoundary::CURRENT_ROW_RANGE,
			                WindowBoundary::CURRENT_ROW_GROUPS);
			break;
		case WindowBoundary::UNBOUNDED_PRECEDING:
			if (entry.end != WindowBoundary::CURRENT_ROW_RANGE) {
				from = "UNBOUNDED PRECEDING";
			}
			break;
		case WindowBoundary::EXPR_PRECEDING_ROWS:
		case WindowBoundary::EXPR_PRECEDING_RANGE:
		case WindowBoundary::EXPR_PRECEDING_GROUPS:
			from = entry.start_expr->ToString() + " PRECEDING";
			units = ToUnits(entry.start, WindowBoundary::EXPR_PRECEDING_ROWS, WindowBoundary::EXPR_PRECEDING_RANGE,
			                WindowBoundary::EXPR_PRECEDING_GROUPS);
			break;
		case WindowBoundary::EXPR_FOLLOWING_ROWS:
		case WindowBoundary::EXPR_FOLLOWING_RANGE:
		case WindowBoundary::EXPR_FOLLOWING_GROUPS:
			from = entry.start_expr->ToString() + " FOLLOWING";
			units = ToUnits(entry.start, WindowBoundary::EXPR_FOLLOWING_ROWS, WindowBoundary::EXPR_FOLLOWING_RANGE,
			                WindowBoundary::EXPR_FOLLOWING_GROUPS);
			break;
		case WindowBoundary::UNBOUNDED_FOLLOWING:
		case WindowBoundary::INVALID:
			throw InternalException("Unrecognized FROM in WindowExpression");
		}

		string to;
		switch (entry.end) {
		case WindowBoundary::CURRENT_ROW_RANGE:
			if (entry.start != WindowBoundary::UNBOUNDED_PRECEDING) {
				to = "CURRENT ROW";
				units = "RANGE";
			}
			break;
		case WindowBoundary::CURRENT_ROW_ROWS:
		case WindowBoundary::CURRENT_ROW_GROUPS:
			to = "CURRENT ROW";
			units = ToUnits(entry.end, WindowBoundary::CURRENT_ROW_ROWS, WindowBoundary::CURRENT_ROW_RANGE,
			                WindowBoundary::CURRENT_ROW_GROUPS);
			break;
		case WindowBoundary::UNBOUNDED_PRECEDING:
			to = "UNBOUNDED PRECEDING";
			break;
		case WindowBoundary::UNBOUNDED_FOLLOWING:
			to = "UNBOUNDED FOLLOWING";
			break;
		case WindowBoundary::EXPR_PRECEDING_ROWS:
		case WindowBoundary::EXPR_PRECEDING_RANGE:
		case WindowBoundary::EXPR_PRECEDING_GROUPS:
			to = entry.end_expr->ToString() + " PRECEDING";
			units = ToUnits(entry.end, WindowBoundary::EXPR_PRECEDING_ROWS, WindowBoundary::EXPR_PRECEDING_RANGE,
			                WindowBoundary::EXPR_PRECEDING_GROUPS);
			break;
		case WindowBoundary::EXPR_FOLLOWING_ROWS:
		case WindowBoundary::EXPR_FOLLOWING_RANGE:
		case WindowBoundary::EXPR_FOLLOWING_GROUPS:
			to = entry.end_expr->ToString() + " FOLLOWING";
			units = ToUnits(entry.end, WindowBoundary::EXPR_FOLLOWING_ROWS, WindowBoundary::EXPR_FOLLOWING_RANGE,
			                WindowBoundary::EXPR_FOLLOWING_GROUPS);
			break;
		case WindowBoundary::INVALID:
			throw InternalException("Unrecognized TO in WindowExpression");
		}
		if (entry.exclude_clause != WindowExcludeMode::NO_OTHER) {
			// if we have an explicit EXCLUDE we always need to fill in from/to
			if (from.empty()) {
				from = "UNBOUNDED PRECEDING";
			}
			if (to.empty()) {
				to = "CURRENT ROW";
				units = "RANGE";
			}
		}

		if (!from.empty() || !to.empty()) {
			result += sep + units;
		}
		if (!from.empty() && !to.empty()) {
			result += " BETWEEN ";
			result += from;
			result += " AND ";
			result += to;
		} else if (!from.empty()) {
			result += " ";
			result += from;
		} else if (!to.empty()) {
			result += " ";
			result += to;
		}

		if (entry.exclude_clause != WindowExcludeMode::NO_OTHER) {
			result += " EXCLUDE ";
		}
		switch (entry.exclude_clause) {
		case WindowExcludeMode::CURRENT_ROW:
			result += "CURRENT ROW";
			break;
		case WindowExcludeMode::GROUP:
			result += "GROUP";
			break;
		case WindowExcludeMode::TIES:
			result += "TIES";
			break;
		default:
			break;
		}

		result += ")";

		return result;
	}